

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  size_t sVar1;
  float fVar2;
  float x0;
  float y0;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  ImFont *pIVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  int off_y_1;
  long lVar10;
  uchar *puVar11;
  int iVar12;
  uint uVar13;
  int off_x;
  char *pcVar14;
  long lVar15;
  ImFontAtlasCustomRect *pIVar16;
  int off_y;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  size_t __n;
  long lVar21;
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  int iVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  long local_48;
  
  iVar12 = atlas->PackIdMouseCursors;
  pIVar16 = (atlas->CustomRects).Data;
  lVar10 = (long)atlas->TexWidth;
  uVar9 = (ulong)pIVar16[iVar12].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar8 = atlas->TexPixelsRGBA32 + (ulong)pIVar16[iVar12].X + lVar10 * (ulong)pIVar16[iVar12].Y
      ;
      pcVar14 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar17 = 0;
      do {
        lVar10 = 0;
        do {
          puVar8[lVar10] = -(uint)(pcVar14[lVar10] == '.');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar17 = iVar17 + 1;
        puVar8 = puVar8 + atlas->TexWidth;
        pcVar14 = pcVar14 + 0x7a;
      } while (iVar17 != 0x1b);
      puVar8 = atlas->TexPixelsRGBA32 +
               uVar9 + 0x7b + (long)atlas->TexWidth * (ulong)pIVar16[iVar12].Y;
      pcVar14 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar17 = 0;
      do {
        lVar10 = 0;
        do {
          puVar8[lVar10] = -(uint)(pcVar14[lVar10] == 'X');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar17 = iVar17 + 1;
        puVar8 = puVar8 + atlas->TexWidth;
        pcVar14 = pcVar14 + 0x7a;
      } while (iVar17 != 0x1b);
    }
    else {
      puVar11 = atlas->TexPixelsAlpha8 + lVar10 * (ulong)pIVar16[iVar12].Y + uVar9;
      pcVar14 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar17 = 0;
      do {
        lVar10 = 0;
        do {
          puVar11[lVar10] = -(pcVar14[lVar10] == '.');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar17 = iVar17 + 1;
        puVar11 = puVar11 + atlas->TexWidth;
        pcVar14 = pcVar14 + 0x7a;
      } while (iVar17 != 0x1b);
      puVar11 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar16[iVar12].Y + uVar9 + 0x7b;
      pcVar14 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar17 = 0;
      do {
        lVar10 = 0;
        do {
          puVar11[lVar10] = -(pcVar14[lVar10] == 'X');
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x7a);
        iVar17 = iVar17 + 1;
        puVar11 = puVar11 + atlas->TexWidth;
        pcVar14 = pcVar14 + 0x7a;
      } while (iVar17 != 0x1b);
    }
  }
  else {
    lVar15 = (ulong)pIVar16[iVar12].Y * lVar10 + uVar9;
    lVar21 = (long)(int)lVar15;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      lVar10 = (long)(atlas->TexWidth + (int)lVar15);
      atlas->TexPixelsRGBA32[lVar10 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar10] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar21 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar21] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[lVar21 + lVar10 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar21 + lVar10] = 0xff;
      atlas->TexPixelsAlpha8[lVar15 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar15] = 0xff;
    }
  }
  uVar7._0_2_ = pIVar16[iVar12].X;
  uVar7._2_2_ = pIVar16[iVar12].Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar7 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar7 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar16 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_48 = 0;
    iVar12 = 0;
    __n = 0;
    auVar31 = _DAT_0024a060;
    do {
      uVar4 = pIVar16->Width;
      iVar17 = (int)__n;
      uVar7 = (uint)uVar4 - iVar17;
      uVar13 = uVar7 >> 1;
      uVar9 = (ulong)uVar13;
      uVar18 = iVar17 + uVar13;
      uVar19 = (uint)uVar4;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar8 = atlas->TexPixelsRGBA32;
        uVar20 = (ulong)(((uint)pIVar16->Y + iVar17) * atlas->TexWidth + (uint)pIVar16->X);
        if (1 < uVar7) {
          uVar7 = iVar12 + (uint)uVar4 >> 1;
          lVar10 = (ulong)(uVar7 + (uVar7 == 0)) - 1;
          auVar22._8_4_ = (int)lVar10;
          auVar22._0_8_ = lVar10;
          auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar10 = 0;
          auVar27 = _DAT_00252370;
          auVar25 = _DAT_00252360;
          do {
            auVar26 = auVar22 ^ auVar31;
            auVar29 = auVar27 ^ auVar31;
            iVar24 = auVar26._4_4_;
            if ((bool)(~(iVar24 < auVar29._4_4_ ||
                        auVar26._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar24) & 1)) {
              *(undefined4 *)((long)puVar8 + lVar10 + uVar20 * 4) = 0xffffff;
            }
            if (auVar29._12_4_ <= auVar26._12_4_ &&
                (auVar29._8_4_ <= auVar26._8_4_ || auVar29._12_4_ != auVar26._12_4_)) {
              *(undefined4 *)((long)puVar8 + lVar10 + uVar20 * 4 + 4) = 0xffffff;
            }
            iVar30 = SUB164(auVar25 ^ auVar31,4);
            if (iVar30 <= iVar24 &&
                (iVar30 != iVar24 || SUB164(auVar25 ^ auVar31,0) <= auVar26._0_4_)) {
              *(undefined4 *)((long)puVar8 + lVar10 + uVar20 * 4 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar8 + lVar10 + uVar20 * 4 + 0xc) = 0xffffff;
            }
            lVar21 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar21 + 4;
            lVar21 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar21 + 4;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(uVar7 + (uVar7 == 0) + 3 & 0xfffffffc) << 2 != lVar10);
        }
        if (__n != 0) {
          memset(puVar8 + uVar20 + uVar9,0xff,__n * 4);
          auVar31 = _DAT_0024a060;
        }
        if (uVar4 != uVar18) {
          uVar7 = uVar19 + iVar12 >> 1;
          uVar18 = (uVar19 + iVar12) - uVar7;
          lVar10 = (ulong)(uVar18 + (uVar18 == 0)) - 1;
          auVar23._8_4_ = (int)lVar10;
          auVar23._0_8_ = lVar10;
          auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar10 = local_48 + (ulong)uVar7 * 4 + uVar20 * 4;
          auVar23 = auVar23 ^ auVar31;
          uVar9 = 0;
          auVar26 = _DAT_00252370;
          auVar29 = _DAT_00252360;
          do {
            auVar27 = auVar26 ^ auVar31;
            iVar24 = auVar23._4_4_;
            if ((bool)(~(auVar27._4_4_ == iVar24 && auVar23._0_4_ < auVar27._0_4_ ||
                        iVar24 < auVar27._4_4_) & 1)) {
              *(undefined4 *)((long)puVar8 + uVar9 + lVar10) = 0xffffff;
            }
            if ((auVar27._12_4_ != auVar23._12_4_ || auVar27._8_4_ <= auVar23._8_4_) &&
                auVar27._12_4_ <= auVar23._12_4_) {
              *(undefined4 *)((long)puVar8 + uVar9 + lVar10 + 4) = 0xffffff;
            }
            iVar30 = SUB164(auVar29 ^ auVar31,4);
            if (iVar30 <= iVar24 &&
                (iVar30 != iVar24 || SUB164(auVar29 ^ auVar31,0) <= auVar23._0_4_)) {
              *(undefined4 *)((long)puVar8 + uVar9 + lVar10 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar8 + uVar9 + lVar10 + 0xc) = 0xffffff;
            }
            lVar21 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar21 + 4;
            lVar21 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 4;
            auVar29._8_8_ = lVar21 + 4;
            uVar9 = uVar9 + 0x10;
          } while ((((ulong)uVar18 + (ulong)((ulong)uVar18 == 0)) * 4 + 0xc & 0x7fffffff0) != uVar9)
          ;
        }
      }
      else {
        puVar11 = atlas->TexPixelsAlpha8 +
                  (((uint)pIVar16->Y + iVar17) * atlas->TexWidth + (uint)pIVar16->X);
        if (1 < uVar7) {
          memset(puVar11,0,uVar9);
          auVar31 = _DAT_0024a060;
        }
        if (__n != 0) {
          memset(puVar11 + uVar9,0xff,__n);
          auVar31 = _DAT_0024a060;
        }
        if (uVar19 != uVar18) {
          memset(puVar11 + uVar9 + __n,0,(ulong)((uVar19 - uVar18) + (uint)(uVar19 - uVar18 == 0)));
          auVar31 = _DAT_0024a060;
        }
      }
      uVar4 = pIVar16->X;
      uVar5 = pIVar16->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar28 = (atlas->TexUvScale).y;
      sVar1 = __n + 1;
      atlas->TexUvLines[__n].x = (float)((uVar4 + uVar13) - 1) * fVar2;
      fVar28 = ((float)(int)(uVar5 + 1 + iVar17) * fVar28 +
               (float)(int)((uint)uVar5 + iVar17) * fVar28) * 0.5;
      atlas->TexUvLines[__n].y = fVar28;
      atlas->TexUvLines[__n].z = fVar2 * (float)((uint)uVar4 + (int)sVar1 + uVar13);
      atlas->TexUvLines[__n].w = fVar28;
      iVar12 = iVar12 + -1;
      local_48 = local_48 + 4;
      __n = sVar1;
    } while (sVar1 != 0x40);
  }
  iVar12 = (atlas->CustomRects).Size;
  if (0 < iVar12) {
    lVar10 = 0;
    lVar21 = 0;
    do {
      pIVar16 = (atlas->CustomRects).Data;
      pIVar6 = *(ImFont **)((long)&pIVar16->Font + lVar10);
      if ((pIVar6 != (ImFont *)0x0) &&
         (iVar17 = *(int *)((long)&pIVar16->GlyphID + lVar10), iVar17 != 0)) {
        uVar7 = (uint)*(ushort *)((long)&pIVar16->X + lVar10);
        fVar2 = (atlas->TexUvScale).x;
        fVar28 = (atlas->TexUvScale).y;
        uVar18 = (uint)*(ushort *)((long)&pIVar16->Y + lVar10);
        uVar19 = (uint)*(ushort *)((long)&pIVar16->Width + lVar10);
        uVar13 = (uint)*(ushort *)((long)&pIVar16->Height + lVar10);
        x0 = *(float *)((long)&(pIVar16->GlyphOffset).x + lVar10);
        y0 = *(float *)((long)&(pIVar16->GlyphOffset).y + lVar10);
        ImFont::AddGlyph(pIVar6,(ImFontConfig *)0x0,(ImWchar)iVar17,x0,y0,(float)uVar19 + x0,
                         (float)uVar13 + y0,(float)uVar7 * fVar2,(float)uVar18 * fVar28,
                         (float)(uVar7 + uVar19) * fVar2,(float)(uVar18 + uVar13) * fVar28,
                         *(float *)((long)&pIVar16->GlyphAdvanceX + lVar10));
        iVar12 = (atlas->CustomRects).Size;
      }
      lVar21 = lVar21 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar21 < iVar12);
  }
  iVar12 = (atlas->Fonts).Size;
  if (0 < iVar12) {
    lVar10 = 0;
    do {
      pIVar6 = (atlas->Fonts).Data[lVar10];
      if (pIVar6->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar6);
        iVar12 = (atlas->Fonts).Size;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar12);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}